

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O3

void __thiscall cmVirtualDirectoryWatcher::StopWatching(cmVirtualDirectoryWatcher *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->Children)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    (*(code *)(p_Var1[5]._M_nxt)->_M_nxt[6]._M_nxt)();
  }
  return;
}

Assistant:

void StopWatching() override
  {
    for (auto const& child : this->Children) {
      child.second->StopWatching();
    }
  }